

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O1

ObservationHistoryTree * __thiscall
PlanningUnitMADPDiscrete::CreateObservationHistoryTree(PlanningUnitMADPDiscrete *this,Index agentI)

{
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *pvVar1;
  vector<ObservationHistoryTree*,std::allocator<ObservationHistoryTree*>> *this_00;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar2;
  size_t sVar3;
  iterator iVar4;
  iterator __position;
  ulong uVar5;
  iterator iVar6;
  pointer pvVar7;
  PlanningUnitMADPDiscrete *pPVar8;
  long lVar9;
  ObservationHistoryTree *pOVar10;
  Index IVar11;
  size_t o;
  ObservationHistory *pOVar12;
  ostream *poVar13;
  TreeNode<ObservationHistory> *pTVar14;
  _Rb_tree_header *p_Var15;
  int iVar16;
  TreeNode<ObservationHistory> *pTVar17;
  uint uVar18;
  LIndex sucI;
  ObservationHistoryTree *oht;
  ObservationHistoryTree *next_oht;
  ObservationHistoryTree *root;
  queue<ObservationHistoryTree_*,_std::deque<ObservationHistoryTree_*,_std::allocator<ObservationHistoryTree_*>_>_>
  ohtQueue;
  uint local_d4;
  TreeNode<ObservationHistory> *local_d0;
  int local_c4;
  PlanningUnitMADPDiscrete *local_c0;
  long local_b8;
  TreeNode<ObservationHistory> *local_b0;
  TreeNode<ObservationHistory> *local_a8;
  ObservationHistoryTree *local_a0;
  _Deque_base<ObservationHistoryTree_*,_std::allocator<ObservationHistoryTree_*>_> local_98;
  ulong local_40;
  ulong local_38;
  
  uVar5 = (ulong)agentI;
  local_98._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_98._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_98._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_98._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_98._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_98._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_98._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_98._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_98._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_98._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  std::_Deque_base<ObservationHistoryTree_*,_std::allocator<ObservationHistoryTree_*>_>::
  _M_initialize_map(&local_98,0);
  sVar3 = (this->super_PlanningUnit)._m_horizon;
  o = (**(code **)((long)*this->_m_madp + 0xc0))(this->_m_madp,uVar5);
  local_a8 = (TreeNode<ObservationHistory> *)0x0;
  pOVar12 = (ObservationHistory *)operator_new(0x30);
  local_c0 = this;
  ObservationHistory::ObservationHistory(pOVar12,this,agentI);
  local_a0 = (ObservationHistoryTree *)operator_new(0x58);
  p_Var15 = &(local_a0->super_TreeNode<ObservationHistory>)._m_successor._M_t._M_impl.
             super__Rb_tree_header;
  (local_a0->super_TreeNode<ObservationHistory>)._m_successor._M_t._M_impl.super__Rb_tree_header.
  _M_header._M_color = _S_red;
  (local_a0->super_TreeNode<ObservationHistory>)._m_successor._M_t._M_impl.super__Rb_tree_header.
  _M_header._M_parent = (_Base_ptr)0x0;
  (local_a0->super_TreeNode<ObservationHistory>)._m_successor._M_t._M_impl.super__Rb_tree_header.
  _M_header._M_left = &p_Var15->_M_header;
  (local_a0->super_TreeNode<ObservationHistory>)._m_successor._M_t._M_impl.super__Rb_tree_header.
  _M_header._M_right = &p_Var15->_M_header;
  (local_a0->super_TreeNode<ObservationHistory>)._m_successor._M_t._M_impl.super__Rb_tree_header.
  _M_node_count = 0;
  (local_a0->super_TreeNode<ObservationHistory>)._m_pred = (TreeNode<ObservationHistory> *)0x0;
  (local_a0->super_TreeNode<ObservationHistory>)._m_index = 0;
  (local_a0->super_TreeNode<ObservationHistory>)._m_indexValid = false;
  (local_a0->super_TreeNode<ObservationHistory>)._m_containedElem = pOVar12;
  (local_a0->super_TreeNode<ObservationHistory>)._vptr_TreeNode =
       (_func_int **)&PTR__TreeNode_005cd680;
  if (local_98._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_98._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<ObservationHistoryTree*,std::allocator<ObservationHistoryTree*>>::
    _M_push_back_aux<ObservationHistoryTree*const&>
              ((deque<ObservationHistoryTree*,std::allocator<ObservationHistoryTree*>> *)&local_98,
               &local_a0);
  }
  else {
    *local_98._M_impl.super__Deque_impl_data._M_finish._M_cur = local_a0;
    local_98._M_impl.super__Deque_impl_data._M_finish._M_cur =
         local_98._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
  }
  local_b8 = uVar5 * 3;
  pvVar1 = (local_c0->_m_firstOHIforT).
           super__Vector_base<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + uVar5;
  local_d0 = (TreeNode<ObservationHistory> *)0x0;
  iVar4._M_current =
       (pvVar1->super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>)._M_impl
       .super__Vector_impl_data._M_finish;
  local_40 = uVar5;
  if (iVar4._M_current ==
      (pvVar1->super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::
    _M_realloc_insert<unsigned_long_long>(pvVar1,iVar4,(unsigned_long_long *)&local_d0);
  }
  else {
    *iVar4._M_current = 0;
    (pvVar1->super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar4._M_current + 1;
  }
  local_38 = sVar3 + 0xffffffff & 0xffffffff;
  local_d4 = 0;
  pTVar17 = (TreeNode<ObservationHistory> *)0x0;
  while (lVar9 = local_b8, pPVar8 = local_c0, iVar16 = (int)pTVar17,
        ((long)local_98._M_impl.super__Deque_impl_data._M_start._M_last -
         (long)local_98._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) +
        ((long)local_98._M_impl.super__Deque_impl_data._M_finish._M_cur -
         (long)local_98._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) +
        ((((ulong)((long)local_98._M_impl.super__Deque_impl_data._M_finish._M_node -
                  (long)local_98._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
        (ulong)(local_98._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)) *
        0x40 != 0) {
    local_d0 = &(*local_98._M_impl.super__Deque_impl_data._M_start._M_cur)->
                super_TreeNode<ObservationHistory>;
    local_d0->_m_index = (LIndex)pTVar17;
    local_d0->_m_indexValid = true;
    this_00 = (vector<ObservationHistoryTree*,std::allocator<ObservationHistoryTree*>> *)
              ((long)&(((local_c0->_m_observationHistoryTreeVectors).
                        super__Vector_base<std::vector<ObservationHistoryTree_*,_std::allocator<ObservationHistoryTree_*>_>,_std::allocator<std::vector<ObservationHistoryTree_*,_std::allocator<ObservationHistoryTree_*>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super__Vector_base<ObservationHistoryTree_*,_std::allocator<ObservationHistoryTree_*>_>
                      )._M_impl.super__Vector_impl_data + local_b8 * 8);
    __position._M_current = *(ObservationHistoryTree ***)(this_00 + 8);
    local_c4 = iVar16;
    if (__position._M_current == *(ObservationHistoryTree ***)(this_00 + 0x10)) {
      std::vector<ObservationHistoryTree*,std::allocator<ObservationHistoryTree*>>::
      _M_realloc_insert<ObservationHistoryTree*const&>
                (this_00,__position,(ObservationHistoryTree **)&local_d0);
    }
    else {
      *__position._M_current = (ObservationHistoryTree *)local_d0;
      *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
    }
    uVar5 = (local_d0->_m_containedElem->super_IndividualHistory).super_History._m_length;
    uVar18 = (uint)uVar5;
    if (local_d4 != uVar18) {
      IVar11 = Globals::CastLIndexToIndex
                         (*(LIndex *)
                           (*(long *)((long)&(((local_c0->_m_firstOHIforT).
                                               super__Vector_base<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->
                                             super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                                             )._M_impl.super__Vector_impl_data + local_b8 * 8) +
                           (ulong)local_d4 * 8));
      local_b0 = (TreeNode<ObservationHistory> *)(ulong)(local_c4 - IVar11);
      pvVar2 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               ((long)&(((local_c0->_m_nrObservationHistoriesT).
                         super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                       super__Vector_impl_data + local_b8 * 8);
      iVar6._M_current =
           (pvVar2->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar6._M_current ==
          (pvVar2->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                  (pvVar2,iVar6,(unsigned_long *)&local_b0);
      }
      else {
        *iVar6._M_current = (unsigned_long)local_b0;
        (pvVar2->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
        super__Vector_impl_data._M_finish = iVar6._M_current + 1;
      }
      local_d4 = local_d4 + 1;
      if (local_d4 != uVar18) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"ERROR: CreateObservationHistories:  ++ts != ",0x2c);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"(Index) thisLength !!! ts (now) is: ",0x24);
        poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,"thisLength =",0xc);
        poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
        std::ostream::put((char)poVar13);
        std::ostream::flush();
      }
      pvVar1 = (vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
               ((long)&(((local_c0->_m_firstOHIforT).
                         super__Vector_base<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>).
                       _M_impl.super__Vector_impl_data + local_b8 * 8);
      iVar4._M_current =
           (pvVar1->super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      local_b0 = pTVar17;
      if (iVar4._M_current ==
          (pvVar1->super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::
        _M_realloc_insert<unsigned_long_long>(pvVar1,iVar4,(unsigned_long_long *)&local_b0);
      }
      else {
        *iVar4._M_current = (unsigned_long_long)pTVar17;
        (pvVar1->super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>).
        _M_impl.super__Vector_impl_data._M_finish = iVar4._M_current + 1;
      }
    }
    iVar16 = local_c4;
    if (uVar5 < local_38 && o != 0) {
      sucI = 0;
      do {
        pOVar12 = (ObservationHistory *)operator_new(0x30);
        ObservationHistory::ObservationHistory(pOVar12,(Index)sucI,local_d0->_m_containedElem);
        local_a8 = (TreeNode<ObservationHistory> *)operator_new(0x58);
        p_Var15 = &(local_a8->_m_successor)._M_t._M_impl.super__Rb_tree_header;
        (local_a8->_m_successor)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        (local_a8->_m_successor)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)0x0;
        (local_a8->_m_successor)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &p_Var15->_M_header;
        (local_a8->_m_successor)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             &p_Var15->_M_header;
        (local_a8->_m_successor)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_a8->_m_pred = (TreeNode<ObservationHistory> *)0x0;
        local_a8->_m_index = 0;
        local_a8->_m_indexValid = false;
        local_a8->_m_containedElem = pOVar12;
        local_a8->_vptr_TreeNode = (_func_int **)&PTR__TreeNode_005cd680;
        TreeNode<ObservationHistory>::SetSuccessor(local_d0,sucI,local_a8);
        if (local_98._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_98._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
          std::deque<ObservationHistoryTree*,std::allocator<ObservationHistoryTree*>>::
          _M_push_back_aux<ObservationHistoryTree*const&>
                    ((deque<ObservationHistoryTree*,std::allocator<ObservationHistoryTree*>> *)
                     &local_98,(ObservationHistoryTree **)&local_a8);
        }
        else {
          *local_98._M_impl.super__Deque_impl_data._M_finish._M_cur =
               (ObservationHistoryTree *)local_a8;
          local_98._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_98._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
        }
        sucI = (LIndex)((Index)sucI + 1);
      } while (sucI < o);
    }
    if (local_98._M_impl.super__Deque_impl_data._M_start._M_cur ==
        local_98._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
      operator_delete(local_98._M_impl.super__Deque_impl_data._M_start._M_first,0x200);
      local_98._M_impl.super__Deque_impl_data._M_start._M_cur =
           local_98._M_impl.super__Deque_impl_data._M_start._M_node[1];
      local_98._M_impl.super__Deque_impl_data._M_start._M_last =
           local_98._M_impl.super__Deque_impl_data._M_start._M_cur + 0x40;
      local_98._M_impl.super__Deque_impl_data._M_start._M_first =
           local_98._M_impl.super__Deque_impl_data._M_start._M_cur;
      local_98._M_impl.super__Deque_impl_data._M_start._M_node =
           local_98._M_impl.super__Deque_impl_data._M_start._M_node + 1;
    }
    else {
      local_98._M_impl.super__Deque_impl_data._M_start._M_cur =
           local_98._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
    }
    pTVar17 = (TreeNode<ObservationHistory> *)(ulong)(iVar16 + 1);
  }
  IVar11 = Globals::CastLIndexToIndex
                     (*(LIndex *)
                       (*(long *)((long)&(((local_c0->_m_firstOHIforT).
                                           super__Vector_base<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->
                                         super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                                         )._M_impl.super__Vector_impl_data + local_b8 * 8) +
                       (ulong)local_d4 * 8));
  local_d0 = (TreeNode<ObservationHistory> *)(ulong)(iVar16 - IVar11);
  pvVar2 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
           ((long)&(((pPVar8->_m_nrObservationHistoriesT).
                     super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                   super__Vector_impl_data + lVar9 * 8);
  iVar6._M_current =
       (pvVar2->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar6._M_current ==
      (pvVar2->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
              (pvVar2,iVar6,(unsigned_long *)&local_d0);
  }
  else {
    *iVar6._M_current = (unsigned_long)local_d0;
    (pvVar2->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar6._M_current + 1;
  }
  pTVar14 = (TreeNode<ObservationHistory> *)
            IndexTools::CalculateNumberOfSequences(o,(pPVar8->super_PlanningUnit)._m_horizon - 1);
  if ((pTVar14 != pTVar17) ||
     (pvVar7 = (pPVar8->_m_observationHistoryTreeVectors).
               super__Vector_base<std::vector<ObservationHistoryTree_*,_std::allocator<ObservationHistoryTree_*>_>,_std::allocator<std::vector<ObservationHistoryTree_*,_std::allocator<ObservationHistoryTree_*>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
     pTVar14 !=
     (TreeNode<ObservationHistory> *)
     (*(long *)((long)&(pvVar7->
                       super__Vector_base<ObservationHistoryTree_*,_std::allocator<ObservationHistoryTree_*>_>
                       )._M_impl.super__Vector_impl_data + lVar9 * 8 + 8) -
      *(long *)((long)&(pvVar7->
                       super__Vector_base<ObservationHistoryTree_*,_std::allocator<ObservationHistoryTree_*>_>
                       )._M_impl.super__Vector_impl_data + lVar9 * 8) >> 3))) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr," WARNING:ObservationHistoryIndex=",0x21);
    poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13," nrObsHist=",0xb);
    poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar13," _m_observationHistoryTreeVectors[agentI=",0x29);
    poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,"].size()=",9);
    poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
    std::ostream::put((char)poVar13);
    std::ostream::flush();
  }
  iVar6._M_current =
       (pPVar8->_m_nrObservationHistories).
       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_d0 = pTVar17;
  if (iVar6._M_current ==
      (pPVar8->_m_nrObservationHistories).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
              (&pPVar8->_m_nrObservationHistories,iVar6,(unsigned_long *)&local_d0);
  }
  else {
    *iVar6._M_current = (unsigned_long)pTVar17;
    (pPVar8->_m_nrObservationHistories).
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar6._M_current + 1;
  }
  pOVar10 = local_a0;
  std::_Deque_base<ObservationHistoryTree_*,_std::allocator<ObservationHistoryTree_*>_>::
  ~_Deque_base(&local_98);
  return pOVar10;
}

Assistant:

ObservationHistoryTree*
PlanningUnitMADPDiscrete::CreateObservationHistoryTree(Index agentI)
{
    //we want to number the Observation Histories breadth-first, so we 
    //use a queue:
    queue<ObservationHistoryTree*> ohtQueue;
    
    Index ObservationHistoryIndex = 0;
    Index maxLength = GetHorizon()-1;//max. observation hist length = h-1
    size_t nrO = GetNrObservations(agentI);
    ObservationHistory* next_oh = 0;
    ObservationHistoryTree* next_oht = 0;
    
    // return a new initial (=empty) observation history

    ObservationHistory* oh = new ObservationHistory(*this, agentI);
    ObservationHistoryTree* root = new ObservationHistoryTree(oh);//, nrO);
    ohtQueue.push(root);

    Index ts = 0;
    _m_firstOHIforT[agentI].push_back(ObservationHistoryIndex);
    while(ohtQueue.size() > 0)
    {
        ObservationHistoryTree* oht = ohtQueue.front();
        oht->SetIndex(ObservationHistoryIndex);
        _m_observationHistoryTreeVectors[agentI].push_back(oht);

        size_t thisLength = oht->GetContainedElement()->GetLength(); 
        if(ts != (Index) thisLength) //length 1 <-> ts 1 
        {
            // we've now started processing OHs for the next ts
            Index nr_OHI_for_ts = ObservationHistoryIndex - 
                CastLIndexToIndex(_m_firstOHIforT[agentI][ts]);
#if DEBUG_PUDCOHT
            cout << "First oh for next ts+1: store nr of ts-OH..."<<endl<<
                "_m_firstOHIforT[agentI="<<agentI<<"][ts="<<ts<<"] = "<<
                _m_firstOHIforT[agentI][ts] << ", current OHI = " <<
                ObservationHistoryIndex << endl;
            Index tempIndex = _m_nrObservationHistoriesT[agentI].size();
#endif
            _m_nrObservationHistoriesT[agentI].push_back(nr_OHI_for_ts); 
#if DEBUG_PUDCOHT
            cout << "Set _m_nrObservationHistoriesT[agentI="<<agentI<<"][t="<<
                tempIndex <<" (ts="<<ts<<")] = "<< nr_OHI_for_ts << endl;
#endif
            if(++ts != (Index) thisLength )
                cout << "ERROR: CreateObservationHistories:  ++ts != "<<
                    "(Index) thisLength !!! ts (now) is: "<<ts<<
                    "thisLength =" << thisLength <<endl;
            _m_firstOHIforT[agentI].push_back(ObservationHistoryIndex);            
        }
        
        ObservationHistoryIndex++; //index of an Observation HISTORY
        
        if(thisLength < maxLength)
            for(Index obsI = 0; obsI < nrO; obsI++) //obsI = observation index
            {
                next_oh = new ObservationHistory(obsI, 
                    oht->GetObservationHistory());
                next_oht = new ObservationHistoryTree(next_oh);//, nrO);
                oht->SetSuccessor(obsI, next_oht);
                ohtQueue.push(next_oht);
            }
        ohtQueue.pop();
    }    

    //there is no next time step, so _m_nrObservationHistoriesT[agentI][lastTs]
    //have not been stored yet: do this now
    Index nr_OHI_for_ts = (ObservationHistoryIndex) 
        - CastLIndexToIndex(_m_firstOHIforT[agentI][ts]);
#if DEBUG_PUDCOHT
    cout << "Last ts end: store nr of ts=h-1 OH..."<<endl<<
        "_m_firstOHIforT[agentI="<<agentI<<"][ts="<<ts<<"] = "<<
        _m_firstOHIforT[agentI][ts] << ", current OHI = " <<
        ObservationHistoryIndex << endl;
    Index tempIndex = _m_nrObservationHistoriesT[agentI].size();
#endif
    _m_nrObservationHistoriesT[agentI].push_back(nr_OHI_for_ts);
#if DEBUG_PUDCOHT
    cout << "Set _m_nrObservationHistoriesT[agentI="<<agentI<<"][t="<<tempIndex
         <<" (last time step ts="<<ts<<")] = "<< nr_OHI_for_ts<<endl;
#endif
    //in a horizon h MADP without initial observation, the max. observation 
    //sequence length is h-1 observations (and the minimum is 0).
    size_t nrObsHist;
    size_t length = GetHorizon() - 1; // = maxLength - 1
    nrObsHist = IndexTools::CalculateNumberOfSequences(nrO, length);

    if( ObservationHistoryIndex != nrObsHist || 
        nrObsHist != _m_observationHistoryTreeVectors[agentI].size() )
        cerr << " WARNING:ObservationHistoryIndex="<< ObservationHistoryIndex <<
        " nrObsHist=" << nrObsHist <<" _m_observationHistoryTreeVectors[agentI="
        << agentI<<"].size()=" << _m_observationHistoryTreeVectors[agentI].size()
        << endl;
    
    _m_nrObservationHistories.push_back(ObservationHistoryIndex);

    return(root);
}